

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_string_tests.cpp
# Opt level: O0

void util_string_tests::ConstevalFormatString_NumSpec_invoker(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  long in_FS_OFFSET;
  ConstevalFormatString_NumSpec t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff608;
  std_string *in_stack_fffffffffffff610;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff618;
  const_string *in_stack_fffffffffffff630;
  const_string *msg;
  size_t in_stack_fffffffffffff638;
  undefined1 *__s;
  const_string *in_stack_fffffffffffff640;
  unit_test_log_t *in_stack_fffffffffffff648;
  ConstevalFormatString_NumSpec *this_01;
  undefined1 local_800 [408];
  undefined1 local_668 [408];
  undefined1 local_4d0 [408];
  undefined1 local_338 [408];
  ConstevalFormatString_NumSpec local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  this_01 = local_1a0;
  memset(this_01,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [30])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_338,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [30])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [16])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::setup_conditional<util_string_tests::ConstevalFormatString_NumSpec>
            ((ConstevalFormatString_NumSpec *)0xc01c8d);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_4d0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [30])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [13])in_stack_fffffffffffff610);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff648,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  ConstevalFormatString_NumSpec::test_method(this_01);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  memset(local_668,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [30])in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [19])in_stack_fffffffffffff610);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff618);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,in_stack_fffffffffffff610);
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,in_stack_fffffffffffff640,in_stack_fffffffffffff638,
             in_stack_fffffffffffff630);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  boost::unit_test::teardown_conditional<util_string_tests::ConstevalFormatString_NumSpec>
            ((ConstevalFormatString_NumSpec *)0xc01ec8);
  msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff618,
             (pointer)in_stack_fffffffffffff610,(unsigned_long)in_stack_fffffffffffff608);
  __s = local_800;
  memset(__s,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff608);
  file = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff608);
  boost::operator<<(in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610);
  boost::operator<<(in_stack_fffffffffffff618,(char (*) [30])in_stack_fffffffffffff610);
  this_00 = boost::operator<<(in_stack_fffffffffffff618,(char (*) [15])in_stack_fffffffffffff610);
  s = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_00);
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00,s)
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,(const_string *)file,(size_t)__s,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff608);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ConstevalFormatString_NumSpec)
{
    PassFmt<0>("");
    PassFmt<0>("%%");
    PassFmt<1>("%s");
    PassFmt<0>("%%s");
    PassFmt<0>("s%%");
    PassFmt<1>("%%%s");
    PassFmt<1>("%s%%");
    PassFmt<0>(" 1$s");
    PassFmt<1>("%1$s");
    PassFmt<1>("%1$s%1$s");
    PassFmt<2>("%2$s");
    PassFmt<2>("%2$s 4$s %2$s");
    PassFmt<129>("%129$s 999$s %2$s");
    PassFmt<1>("%02d");
    PassFmt<1>("%+2s");
    PassFmt<1>("%.6i");
    PassFmt<1>("%5.2f");
    PassFmt<1>("%#x");
    PassFmt<1>("%1$5i");
    PassFmt<1>("%1$-5i");
    PassFmt<1>("%1$.5i");
    // tinyformat accepts almost any "type" spec, even '%', or '_', or '\n'.
    PassFmt<1>("%123%");
    PassFmt<1>("%123%s");
    PassFmt<1>("%_");
    PassFmt<1>("%\n");

    // The `*` specifier behavior is unsupported and can lead to runtime
    // errors when used in a ConstevalFormatString. Please refer to the
    // note in the ConstevalFormatString docs.
    PassFmt<1>("%*c");
    PassFmt<2>("%2$*3$d");
    PassFmt<1>("%.*f");

    auto err_mix{"Format specifiers must be all positional or all non-positional!"};
    FailFmtWithError<1>("%s%1$s", err_mix);

    auto err_num{"Format specifier count must match the argument count!"};
    FailFmtWithError<1>("", err_num);
    FailFmtWithError<0>("%s", err_num);
    FailFmtWithError<2>("%s", err_num);
    FailFmtWithError<0>("%1$s", err_num);
    FailFmtWithError<2>("%1$s", err_num);

    auto err_0_pos{"Positional format specifier must have position of at least 1"};
    FailFmtWithError<1>("%$s", err_0_pos);
    FailFmtWithError<1>("%$", err_0_pos);
    FailFmtWithError<0>("%0$", err_0_pos);
    FailFmtWithError<0>("%0$s", err_0_pos);

    auto err_term{"Format specifier incorrectly terminated by end of string"};
    FailFmtWithError<1>("%", err_term);
    FailFmtWithError<1>("%1$", err_term);
}